

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_shr_u8(c_v64 a,uint n)

{
  uint in_ESI;
  int c;
  c_v64 t;
  int local_18;
  byte local_10 [8];
  c_v64 local_8;
  
  if (7 < in_ESI) {
    fprintf(_stderr,"Error: Undefined u8 shift right %d\n",(ulong)in_ESI);
    abort();
  }
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    local_8.u8[local_18] = (uint8_t)((int)(uint)local_10[local_18] >> ((byte)in_ESI & 0x1f));
  }
  return (c_v64)local_8.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.u8[c] = a.u8[c] >> n;
  return t;
}